

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O2

BasicValue * __thiscall
cmm::CMMInterpreter::evaluateBinRelation
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,OperatorKind OpKind,
          BasicValue *LHS,BasicValue *RHS)

{
  bool bVar1;
  undefined8 extraout_RAX;
  CMMInterpreter *pCVar2;
  undefined1 local_e0 [32];
  string local_c0;
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  _Base_ptr local_70;
  size_t sStack_68;
  BasicValue local_60;
  
  if (LHS->Type == RHS->Type) {
    switch(OpKind) {
    case Less:
      bVar1 = cvm::BasicValue::operator<(LHS,RHS);
      break;
    case LessEqual:
      bVar1 = cvm::BasicValue::operator<=(LHS,RHS);
      break;
    case Equal:
      bVar1 = cvm::BasicValue::operator==(LHS,RHS);
      break;
    case NotEqual:
      bVar1 = cvm::BasicValue::operator!=(LHS,RHS);
      break;
    case Greater:
      bVar1 = cvm::BasicValue::operator>(LHS,RHS);
      break;
    case GreaterEqual:
      bVar1 = cvm::BasicValue::operator>=(LHS,RHS);
      break;
    default:
switchD_0010d685_default:
      std::__cxx11::to_string((string *)(local_e0 + 0x20),OpKind);
      pCVar2 = (CMMInterpreter *)local_e0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar2,
                     (string *)(local_e0 + 0x20)," is not a valid binary relational operation kind")
      ;
      RuntimeError(pCVar2,(string *)local_e0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)(local_e0 + 0x20));
      _Unwind_Resume(extraout_RAX);
    }
    __return_storage_ptr__->Type = BoolType;
    (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->StrVal).field_2;
    (__return_storage_ptr__->StrVal)._M_string_length = 0;
    (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->field_2).BoolVal = bVar1;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (1 < (RHS->Type - IntType | LHS->Type - IntType)) {
      pCVar2 = (CMMInterpreter *)local_e0;
      std::__cxx11::string::string
                ((string *)pCVar2,"relational operator should apply to identical type",
                 (allocator *)(local_e0 + 0x20));
      RuntimeError(pCVar2,(string *)local_e0);
      goto switchD_0010d685_default;
    }
    local_60.field_2.DoubleVal = cvm::BasicValue::toDouble(LHS);
    local_60.StrVal._M_dataplus._M_p = (pointer)&local_60.StrVal.field_2;
    local_60.Type = DoubleType;
    local_60.StrVal._M_string_length = 0;
    local_60.StrVal.field_2._M_local_buf[0] = '\0';
    local_60.ArrayPtr.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_60.ArrayPtr.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._16_8_ = cvm::BasicValue::toDouble(RHS);
    local_a0._8_8_ = local_a0 + 0x18;
    local_a0._0_4_ = 2;
    local_a0._16_8_ = 0;
    local_88[0] = _S_red;
    local_70 = (_Base_ptr)0x0;
    sStack_68 = 0;
    evaluateBinRelation(__return_storage_ptr__,this,OpKind,&local_60,(BasicValue *)(local_e0 + 0x40)
                       );
    cvm::BasicValue::~BasicValue((BasicValue *)(local_e0 + 0x40));
    cvm::BasicValue::~BasicValue(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

cvm::BasicValue
CMMInterpreter::evaluateBinRelation(BinaryOperatorAST::OperatorKind OpKind,
                                    cvm::BasicValue LHS, cvm::BasicValue RHS) {
  if (LHS.Type != RHS.Type) {
    if (LHS.isNumeric() && RHS.isNumeric()) {
      return evaluateBinRelation(OpKind, LHS.toDouble(), RHS.toDouble());
    }
    RuntimeError("relational operator should apply to identical type");
  }

  switch (OpKind) {
  default:
    RuntimeError(std::to_string(OpKind) +
        " is not a valid binary relational operation kind");
  case cmm::BinaryOperatorAST::Less:
    return LHS < RHS;
  case cmm::BinaryOperatorAST::LessEqual:
    return LHS <= RHS;
  case cmm::BinaryOperatorAST::Equal:
    return LHS == RHS;
  case cmm::BinaryOperatorAST::NotEqual:
    return LHS != RHS;
  case cmm::BinaryOperatorAST::Greater:
    return LHS > RHS;
  case cmm::BinaryOperatorAST::GreaterEqual:
    return LHS >= RHS;
  }
}